

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O1

Statement *
slang::ast::Statement::bindBlock
          (StatementBlockSymbol *block,SyntaxNode *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SyntaxKind SVar1;
  SyntaxNode *pSVar2;
  SyntaxNode *pSVar3;
  SyntaxKind *pSVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar5;
  int iVar6;
  BlockStatement *stmt;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BlockStatementSyntax *bss;
  Compilation *comp;
  long lVar7;
  StatementSyntax *pSVar8;
  bool bVar9;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  Statement *local_90;
  undefined1 local_88 [64];
  Compilation *local_48;
  SyntaxNode *local_40;
  StatementBlockSymbol *local_38;
  
  comp = ((context->scope).ptr)->compilation;
  SVar1 = syntax->kind;
  local_38 = block;
  if (SVar1 == SequentialBlockStatement) {
LAB_00253b86:
    stmt = (BlockStatement *)
           BlockStatement::fromSyntax(comp,(BlockStatementSyntax *)syntax,context,stmtCtx,true);
    if ((stmt->super_Statement).kind == Invalid) {
      return &stmt->super_Statement;
    }
    (stmt->super_Statement).syntax = (StatementSyntax *)syntax;
    ASTContext::setAttributes
              (context,(Statement *)stmt,
               *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *
                )(syntax + 3));
    bVar9 = false;
  }
  else {
    if (SVar1 == RsCodeBlock) {
      local_88._0_8_ = local_88 + 0x18;
      local_88._8_8_ = 0;
      local_88._16_8_ = 5;
      bindScopeInitializers(context,(SmallVectorBase<const_slang::ast::Statement_*> *)local_88);
      pSVar2 = syntax[3].previewNode;
      local_40 = syntax;
      if (pSVar2 == (SyntaxNode *)0x0) {
        bVar9 = false;
      }
      else {
        pSVar3 = syntax[3].parent;
        lVar7 = 0;
        bVar9 = false;
        local_48 = comp;
        do {
          pSVar4 = *(SyntaxKind **)((long)&pSVar3->kind + lVar7);
          bVar5 = slang::syntax::StatementSyntax::isKind(*pSVar4);
          if (bVar5) {
            iVar6 = bind((int)pSVar4,(sockaddr *)context,(socklen_t)stmtCtx);
            local_90 = (Statement *)CONCAT44(extraout_var,iVar6);
            SmallVectorBase<slang::ast::Statement_const*>::
            emplace_back<slang::ast::Statement_const*>
                      ((SmallVectorBase<slang::ast::Statement_const*> *)local_88,&local_90);
            bVar9 = (bool)(bVar9 | ((Statement *)CONCAT44(extraout_var,iVar6))->kind == Invalid);
          }
          lVar7 = lVar7 + 8;
          comp = local_48;
        } while ((long)pSVar2 << 3 != lVar7);
      }
      stmt = createBlockStatement
                       (comp,(SmallVectorBase<const_slang::ast::Statement_*> *)local_88,local_40,
                        Sequential);
    }
    else {
      if (SVar1 == ParallelBlockStatement) goto LAB_00253b86;
      local_88._0_8_ = local_88 + 0x18;
      local_88._8_8_ = 0;
      local_88._16_8_ = 5;
      bindScopeInitializers(context,(SmallVectorBase<const_slang::ast::Statement_*> *)local_88);
      pSVar8 = (StatementSyntax *)syntax;
      if (syntax->kind == PatternCaseItem) {
        pSVar8 = *(StatementSyntax **)(syntax + 3);
      }
      iVar6 = bind((int)pSVar8,(sockaddr *)context,(socklen_t)stmtCtx);
      local_90 = (Statement *)CONCAT44(extraout_var_00,iVar6);
      SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                ((SmallVectorBase<slang::ast::Statement_const*> *)local_88,&local_90);
      bVar9 = ((Statement *)CONCAT44(extraout_var_00,iVar6))->kind == Invalid;
      stmt = createBlockStatement
                       (comp,(SmallVectorBase<const_slang::ast::Statement_*> *)local_88,syntax,
                        Sequential);
      (stmt->super_Statement).syntax = pSVar8;
      syntax_00._M_ptr =
           (pSVar8->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (pSVar8->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      ASTContext::setAttributes(context,&stmt->super_Statement,syntax_00);
    }
    if ((Statement *)local_88._0_8_ != (Statement *)(local_88 + 0x18)) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  stmt->blockSymbol = local_38;
  if (bVar9) {
    local_88._0_8_ = stmt;
    stmt = (BlockStatement *)
           BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                     (&comp->super_BumpAllocator,(Statement **)local_88);
  }
  return &stmt->super_Statement;
}

Assistant:

const Statement& Statement::bindBlock(const StatementBlockSymbol& block, const SyntaxNode& syntax,
                                      const ASTContext& context, StatementContext& stmtCtx) {
    BlockStatement* result;
    bool anyBad = false;
    auto& comp = context.getCompilation();

    if (syntax.kind == SyntaxKind::SequentialBlockStatement ||
        syntax.kind == SyntaxKind::ParallelBlockStatement) {
        auto& bss = syntax.as<BlockStatementSyntax>();
        auto& bs = BlockStatement::fromSyntax(comp, bss, context, stmtCtx,
                                              /* addInitializers */ true);
        if (bs.bad())
            return bs;

        result = &bs.as<BlockStatement>();
        result->syntax = &bss;
        context.setAttributes(*result, bss.attributes);
    }
    else if (syntax.kind == SyntaxKind::RsCodeBlock) {
        SmallVector<const Statement*> buffer;
        bindScopeInitializers(context, buffer);

        for (auto item : syntax.as<RsCodeBlockSyntax>().items) {
            if (StatementSyntax::isKind(item->kind)) {
                auto& stmt = bind(item->as<StatementSyntax>(), context, stmtCtx,
                                  /* inList */ true);
                buffer.push_back(&stmt);
                anyBad |= stmt.bad();
            }
        }

        result = createBlockStatement(comp, buffer, syntax);
    }
    else {
        SmallVector<const Statement*> buffer;
        bindScopeInitializers(context, buffer);

        const StatementSyntax* ss;
        if (syntax.kind == SyntaxKind::PatternCaseItem)
            ss = syntax.as<PatternCaseItemSyntax>().statement;
        else
            ss = &syntax.as<StatementSyntax>();
        auto& stmt = bind(*ss, context, stmtCtx, /* inList */ false,
                          /* labelHandled */ true);
        buffer.push_back(&stmt);
        anyBad |= stmt.bad();

        result = createBlockStatement(comp, buffer, syntax);
        result->syntax = ss;
        context.setAttributes(*result, ss->attributes);
    }

    result->blockSymbol = &block;
    if (anyBad)
        return badStmt(comp, result);

    return *result;
}